

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpWithTcpServer.cpp
# Opt level: O3

void __thiscall sznet::net::KcpWithTcpServer::setThreadNum(KcpWithTcpServer *this,int numThreads)

{
  if (numThreads < 0) {
    __assert_fail("0 <= numThreads",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpWithTcpServer.cpp"
                  ,0x2d,"void sznet::net::KcpWithTcpServer::setThreadNum(int)");
  }
  if (((long)(this->m_udpListenAddrs).
             super__Vector_base<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(this->m_udpListenAddrs).
             super__Vector_base<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>.
             _M_impl.super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7 -
      (ulong)(uint)numThreads == 0) {
    ((this->m_threadPool).
     super___shared_ptr<sznet::net::KcpTcpEventLoopThreadPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    m_numThreads = numThreads;
    return;
  }
  __assert_fail("m_udpListenAddrs.size() == numThreads",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpWithTcpServer.cpp"
                ,0x2e,"void sznet::net::KcpWithTcpServer::setThreadNum(int)");
}

Assistant:

void KcpWithTcpServer::setThreadNum(int numThreads)
{
	assert(0 <= numThreads);
	assert(m_udpListenAddrs.size() == numThreads);
	m_threadPool->setThreadNum(numThreads);
}